

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractstringserialiser.cpp
# Opt level: O2

QString * __thiscall
AbstractStringSerialiserPrivate::saveVariant
          (QString *__return_storage_ptr__,AbstractStringSerialiserPrivate *this,QVariant *val)

{
  double val_00;
  char cVar1;
  QChar QVar2;
  int iVar3;
  char16_t *pcVar4;
  DateFormat DVar5;
  anon_union_24_3_e3d07ef4_for_data local_48;
  QArrayDataPointer<char> local_30;
  
  cVar1 = ::QVariant::isNull();
  if (cVar1 == '\0') {
    iVar3 = ::QVariant::typeId(val);
    DVar5 = (DateFormat)__return_storage_ptr__;
    switch(iVar3) {
    case 0:
      goto switchD_001214cb_caseD_0;
    case 1:
      cVar1 = ::QVariant::toBool();
      if (cVar1 == '\0') {
        (__return_storage_ptr__->d).d = (Data *)0x0;
        pcVar4 = L"0";
      }
      else {
        (__return_storage_ptr__->d).d = (Data *)0x0;
        pcVar4 = L"1";
      }
      (__return_storage_ptr__->d).ptr = pcVar4;
      (__return_storage_ptr__->d).size = 1;
      local_48.shared = (PrivateShared *)0x0;
      local_48._8_8_ = 0;
      local_48._16_8_ = 0;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_48);
      break;
    case 2:
    case 0x20:
    case 0x21:
    case 0x22:
    case 0x28:
      iVar3 = ::QVariant::toInt((bool *)val);
      QString::number(DVar5,iVar3);
      break;
    case 3:
    case 0x23:
    case 0x24:
    case 0x25:
      iVar3 = ::QVariant::toUInt((bool *)val);
      QString::number(DVar5,iVar3);
      break;
    case 4:
      iVar3 = ::QVariant::toLongLong((bool *)val);
      QString::number((longlong)__return_storage_ptr__,iVar3);
      break;
    case 5:
      iVar3 = ::QVariant::toULongLong((bool *)val);
      QString::number((ulonglong)__return_storage_ptr__,iVar3);
      break;
    case 6:
    case 0x26:
      val_00 = (double)::QVariant::toDouble((bool *)val);
      guessDecimalsString(__return_storage_ptr__,val_00,(QLocale *)0x0);
      break;
    case 7:
      QVar2.ucs = ::QVariant::toChar();
      QString::QString(__return_storage_ptr__,QVar2);
      break;
    case 10:
      ::QVariant::toString();
      break;
    case 0xc:
      ::QVariant::toByteArray();
      QByteArray::toBase64(&local_48,&local_30,0);
      QString::fromLatin1<void>(__return_storage_ptr__,(QByteArray *)&local_48);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_48);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_30);
      break;
    case 0xe:
      local_48.shared = (PrivateShared *)::QVariant::toDate();
      QDate::toString(DVar5);
      break;
    case 0xf:
      local_48._0_4_ = ::QVariant::toTime();
      QTime::toString(DVar5);
      break;
    case 0x10:
      ::QVariant::toDateTime();
      QDateTime::toString(DVar5);
      QDateTime::~QDateTime((QDateTime *)local_48.data);
      break;
    default:
      if (iVar3 == 0x1001) {
        qvariant_cast<QPixmap>((QVariant *)&local_30);
        QPixmap::toImage();
        saveImageVariant(__return_storage_ptr__,(QImage *)local_48.data);
        QImage::~QImage((QImage *)local_48.data);
        QPixmap::~QPixmap((QPixmap *)&local_30);
        return __return_storage_ptr__;
      }
      if (iVar3 == 0x1006) {
        qvariant_cast<QImage>((QVariant *)&local_48);
        saveImageVariant(__return_storage_ptr__,(QImage *)local_48.data);
        QImage::~QImage((QImage *)local_48.data);
        return __return_storage_ptr__;
      }
      if (iVar3 == 0x1009) {
        qvariant_cast<QBitmap>((QBitmap *)&local_30,val);
        QPixmap::toImage();
        saveImageVariant(__return_storage_ptr__,(QImage *)local_48.data);
        QImage::~QImage((QImage *)local_48.data);
        QPixmap::~QPixmap((QPixmap *)&local_30);
        return __return_storage_ptr__;
      }
    case 8:
    case 9:
    case 0xb:
    case 0xd:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x16:
    case 0x17:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1c:
    case 0x1d:
    case 0x1e:
    case 0x1f:
    case 0x27:
      variantToString(__return_storage_ptr__,this,val);
    }
  }
  else {
switchD_001214cb_caseD_0:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

QString AbstractStringSerialiserPrivate::saveVariant(const QVariant &val) const
{
    if (val.isNull())
        return QString();
    switch (val.userType()) {
    case QMetaType::UnknownType:
        Q_ASSERT_X(false, "ModelSerialisation::saveVariant", "Trying to save unregistered type.");
        return QString();
    case QMetaType::Bool:
        return val.toBool() ? QStringLiteral("1") : QStringLiteral("0");
    case QMetaType::Long:
    case QMetaType::Short:
    case QMetaType::Char:
    case QMetaType::SChar:
    case QMetaType::Int:
        return QString::number(val.toInt());
    case QMetaType::ULong:
    case QMetaType::UShort:
    case QMetaType::UChar:
    case QMetaType::UInt:
        return QString::number(val.toUInt());
    case QMetaType::LongLong:
        return QString::number(val.toLongLong());
    case QMetaType::ULongLong:
        return QString::number(val.toULongLong());
    case QMetaType::Double:
    case QMetaType::Float:
        return guessDecimalsString(val.toDouble());
    case QMetaType::QChar:
        return QString(val.toChar());
    case QMetaType::QString:
        return val.toString();
    case QMetaType::QByteArray:
        return QString::fromLatin1(val.toByteArray().toBase64());
    case QMetaType::QDate:
        return val.toDate().toString(Qt::ISODate);
    case QMetaType::QTime:
        return val.toTime().toString(Qt::ISODate);
    case QMetaType::QDateTime:
        return val.toDateTime().toString(Qt::ISODate);
#ifdef QT_GUI_LIB
    case QMetaType::QImage:
        return saveImageVariant(val.value<QImage>());
    case QMetaType::QPixmap:
        return saveImageVariant(val.value<QPixmap>().toImage());
    case QMetaType::QBitmap:
        return saveImageVariant(val.value<QBitmap>().toImage());
#endif
    default:
        return variantToString(val);
    }
}